

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
fmt::v5::
format<fmt::v5::basic_string_view<char>,int,int,int,int,int,int,int,int,int,int,int,int,int,int,int>
          (basic_string_view<char> *format_str,int *args,int *args_1,int *args_2,int *args_3,
          int *args_4,int *args_5,int *args_6,int *args_7,int *args_8,int *args_9,int *args_10,
          int *args_11,int *args_12,int *args_13,int *args_14)

{
  size_t in_RDX;
  undefined8 *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string_view<char> bVar1;
  int *in_stack_00000010;
  int *in_stack_00000058;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_15;
  basic_string_view<char> *in_stack_fffffffffffffd68;
  checked_args<fmt::v5::basic_string_view<char>,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int>
  *in_stack_fffffffffffffd70;
  int *in_stack_fffffffffffffdb0;
  int *in_stack_fffffffffffffdb8;
  int *in_stack_fffffffffffffdc0;
  int *in_stack_fffffffffffffdc8;
  int *in_stack_fffffffffffffdd0;
  int *in_stack_fffffffffffffdd8;
  int *in_stack_fffffffffffffde0;
  int *in_stack_fffffffffffffde8;
  int *in_stack_fffffffffffffdf0;
  int *in_stack_fffffffffffffdf8;
  int *in_stack_fffffffffffffe00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  in_stack_ffffffffffffff60;
  
  bVar1.size_ = in_RDX;
  bVar1.data_ = (char *)in_RSI[1];
  args_15 = in_RDI;
  to_string_view<char>((v5 *)*in_RSI,bVar1);
  internal::
  checked_args<fmt::v5::basic_string_view<char>,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int>
  ::checked_args(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,(int *)args_15,(int *)in_RDI,
                 in_stack_00000058,in_stack_00000010,in_stack_fffffffffffffdb0,
                 in_stack_fffffffffffffdb8,in_stack_fffffffffffffdc0,in_stack_fffffffffffffdc8,
                 in_stack_fffffffffffffdd0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffde0,
                 in_stack_fffffffffffffde8,in_stack_fffffffffffffdf0,in_stack_fffffffffffffdf8,
                 in_stack_fffffffffffffe00);
  bVar1 = (basic_string_view<char>)
          internal::
          checked_args<fmt::v5::basic_string_view<char>,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int>
          ::operator*((checked_args<fmt::v5::basic_string_view<char>,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int>
                       *)0x21b15e);
  internal::vformat<char>(bVar1,in_stack_ffffffffffffff60);
  return args_15;
}

Assistant:

inline std::basic_string<FMT_CHAR(S)> format(
    const S &format_str, const Args &... args) {
  return internal::vformat(
    to_string_view(format_str),
    *internal::checked_args<S, Args...>(format_str, args...));
}